

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosXMLUtil.cpp
# Opt level: O1

unique_ptr<pugi::xml_document,_std::default_delete<pugi::xml_document>_> __thiscall
adios2::helper::XMLDocument(helper *this,string *xmlContents,string *hint)

{
  bool bVar1;
  xml_document *this_00;
  char *pcVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  xml_parse_result parse_result;
  allocator local_129;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  xml_parse_result local_48;
  
  this_00 = (xml_document *)operator_new(0xd0);
  pugi::xml_document::xml_document(this_00);
  *(xml_document **)this = this_00;
  pugi::xml_document::load_buffer_inplace
            (&local_48,this_00,(xmlContents->_M_dataplus)._M_p,xmlContents->_M_string_length,0x74,
             encoding_auto);
  bVar1 = pugi::xml_parse_result::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Helper","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"adiosXMLUtil","");
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"XMLDocument","");
    pcVar2 = pugi::xml_parse_result::description(&local_48);
    std::__cxx11::string::string((string *)local_68,pcVar2,&local_129);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x7530ba);
    local_128 = &local_118;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_118 = *plVar4;
      lStack_110 = plVar3[3];
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*plVar3;
    }
    local_120 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_128);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_f8 = *plVar4;
      lStack_f0 = plVar3[3];
      local_108 = &local_f8;
    }
    else {
      local_f8 = *plVar4;
      local_108 = (long *)*plVar3;
    }
    local_100 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_108,(ulong)(hint->_M_dataplus)._M_p);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8.field_2._8_8_ = plVar3[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_e8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    Throw<std::invalid_argument>(&local_88,&local_a8,&local_c8,&local_e8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  return (__uniq_ptr_data<pugi::xml_document,_std::default_delete<pugi::xml_document>,_true,_true>)
         (__uniq_ptr_data<pugi::xml_document,_std::default_delete<pugi::xml_document>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<pugi::xml_document> XMLDocument(const std::string &xmlContents,
                                                const std::string hint)
{
    std::unique_ptr<pugi::xml_document> document(new pugi::xml_document);
    auto parse_result =
        document->load_buffer_inplace(const_cast<char *>(xmlContents.data()), xmlContents.size());

    if (!parse_result)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosXMLUtil", "XMLDocument",
            "parse error in XML string, description: " + std::string(parse_result.description()) +
                ", check with any XML editor if format is ill-formed, " + hint);
    }
    return document;
}